

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O2

void __thiscall
chaiscript::dispatch::
Proxy_Function_Callable_Impl<const_chaiscript::Boxed_Number_(const_chaiscript::Boxed_Number_&,_const_chaiscript::Boxed_Number_&),_const_chaiscript::Boxed_Number_(*)(const_chaiscript::Boxed_Number_&,_const_chaiscript::Boxed_Number_&)>
::Proxy_Function_Callable_Impl
          (Proxy_Function_Callable_Impl<const_chaiscript::Boxed_Number_(const_chaiscript::Boxed_Number_&,_const_chaiscript::Boxed_Number_&),_const_chaiscript::Boxed_Number_(*)(const_chaiscript::Boxed_Number_&,_const_chaiscript::Boxed_Number_&)>
           *this,_func_Boxed_Number_Boxed_Number_ptr_Boxed_Number_ptr *f)

{
  _func_Boxed_Number_Boxed_Number_ptr_Boxed_Number_ptr *in_RDX;
  _Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> local_30;
  
  detail::
  build_param_type_list<chaiscript::Boxed_Number_const,chaiscript::Boxed_Number_const&,chaiscript::Boxed_Number_const&>
            ((vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)&local_30,
             (detail *)0x0,in_RDX);
  Proxy_Function_Impl_Base::Proxy_Function_Impl_Base
            (&this->super_Proxy_Function_Impl_Base,
             (vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)&local_30);
  std::_Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::~_Vector_base
            (&local_30);
  (this->super_Proxy_Function_Impl_Base).super_Proxy_Function_Base._vptr_Proxy_Function_Base =
       (_func_int **)&PTR__Proxy_Function_Base_004828a0;
  this->m_f = f;
  return;
}

Assistant:

explicit Proxy_Function_Callable_Impl(Callable f)
          : Proxy_Function_Impl_Base(detail::build_param_type_list(static_cast<Func *>(nullptr)))
          , m_f(std::move(f)) {
      }